

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Base64Encoding.cpp
# Opt level: O2

size_t axl::enc::Base64Encoding::encode(String *string,void *p,size_t size,uint_t flags)

{
  long lVar1;
  C *pCVar2;
  ulong uVar3;
  size_t length;
  C *pCVar4;
  char *pcVar5;
  C *pCVar6;
  uint uVar7;
  size_t i;
  ulong uVar8;
  byte *pbVar9;
  bool bVar10;
  
  if (size == 0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(string);
    length = 0;
  }
  else {
    lVar1 = ((size * 8) / 6 + 1) - (ulong)((size * 8) % 6 == 0);
    uVar3 = (ulong)(-(int)lVar1 & 3);
    if ((flags & 1) != 0) {
      uVar3 = 0;
    }
    length = uVar3 + lVar1;
    if ((flags & 8) != 0) {
      length = ((length >> 6) + length) - (ulong)((length & 0xfc0) == 0);
    }
    pCVar2 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
                       (string,length,false);
    if (pCVar2 == (C *)0x0) {
      length = 0xffffffffffffffff;
    }
    else {
      pbVar9 = (byte *)(size + (long)p);
      uVar7 = 0;
      if ((flags & 8) == 0) {
        if ((flags & 2) == 0) {
          uVar3 = 0;
          pCVar4 = pCVar2;
          for (; p < pbVar9; p = (void *)((long)p + 1)) {
            uVar7 = (uint)*p | uVar7 << 8;
            uVar3 = uVar3 + 8;
            while (5 < uVar3) {
              uVar3 = uVar3 - 6;
              *pCVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [uVar7 >> ((byte)uVar3 & 0x1f) & 0x3f];
              pCVar4 = pCVar4 + 1;
            }
          }
          if (uVar3 != 0) {
            *pCVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [uVar7 << (6U - (char)uVar3 & 0x1f) & 0x3f];
            pCVar4 = pCVar4 + 1;
          }
          for (; pCVar4 < pCVar2 + length; pCVar4 = pCVar4 + 1) {
            *pCVar4 = '=';
          }
        }
        else {
          uVar3 = 0;
          pCVar4 = pCVar2;
          for (; p < pbVar9; p = (void *)((long)p + 1)) {
            uVar7 = (uint)*p | uVar7 << 8;
            uVar3 = uVar3 + 8;
            while (5 < uVar3) {
              uVar3 = uVar3 - 6;
              *pCVar4 = GetBase64UrlChar::operator()(unsigned_char)::charTable
                        [uVar7 >> ((byte)uVar3 & 0x1f) & 0x3f];
              pCVar4 = pCVar4 + 1;
            }
          }
          if (uVar3 != 0) {
            *pCVar4 = GetBase64UrlChar::operator()(unsigned_char)::charTable
                      [uVar7 << (6U - (char)uVar3 & 0x1f) & 0x3f];
            pCVar4 = pCVar4 + 1;
          }
          for (; pCVar4 < pCVar2 + length; pCVar4 = pCVar4 + 1) {
            *pCVar4 = '=';
          }
        }
      }
      else if ((flags & 2) == 0) {
        uVar3 = 0;
        uVar8 = 0;
        pCVar4 = pCVar2;
        for (; p < pbVar9; p = (void *)((long)p + 1)) {
          uVar7 = (uint)*p | uVar7 << 8;
          uVar3 = uVar3 + 8;
          while (5 < uVar3) {
            bVar10 = (uVar8 & 0x3f) == 0;
            if (bVar10) {
              *pCVar4 = '\n';
            }
            uVar3 = uVar3 - 6;
            pcVar5 = pCVar4 + bVar10;
            pCVar4 = pcVar5 + 1;
            *pcVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [uVar7 >> ((byte)uVar3 & 0x1f) & 0x3f];
            uVar8 = uVar8 + 1;
          }
        }
        if (uVar3 != 0) {
          *pCVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [uVar7 << (6U - (char)uVar3 & 0x1f) & 0x3f];
          pCVar4 = pCVar4 + 1;
        }
        for (; pCVar4 < pCVar2 + length; pCVar4 = pCVar4 + 1) {
          *pCVar4 = '=';
        }
      }
      else {
        uVar3 = 0;
        uVar8 = 0;
        pCVar4 = pCVar2;
        for (; p < pbVar9; p = (void *)((long)p + 1)) {
          uVar7 = (uint)*p | uVar7 << 8;
          uVar3 = uVar3 + 8;
          while (5 < uVar3) {
            bVar10 = (uVar8 & 0x3f) == 0;
            if (bVar10) {
              *pCVar4 = '\n';
            }
            uVar3 = uVar3 - 6;
            pCVar6 = pCVar4 + bVar10;
            pCVar4 = pCVar6 + 1;
            *pCVar6 = GetBase64UrlChar::operator()(unsigned_char)::charTable
                      [uVar7 >> ((byte)uVar3 & 0x1f) & 0x3f];
            uVar8 = uVar8 + 1;
          }
        }
        if (uVar3 != 0) {
          *pCVar4 = GetBase64UrlChar::operator()(unsigned_char)::charTable
                    [uVar7 << (6U - (char)uVar3 & 0x1f) & 0x3f];
          pCVar4 = pCVar4 + 1;
        }
        for (; pCVar4 < pCVar2 + length; pCVar4 = pCVar4 + 1) {
          *pCVar4 = '=';
        }
      }
    }
  }
  return length;
}

Assistant:

size_t
Base64Encoding::encode(
	sl::String* string,
	const void* p,
	size_t size,
	uint_t flags
) {
	if (!size) {
		string->clear();
		return 0;
	}

	size_t bitCount = size * 8;
	size_t length = bitCount / 6;
	if (bitCount % 6)
		length++;

	if (!(flags & Base64EncodingFlag_NoPadding))
		length += 3 - ((length - 1) & 3);

	if (flags & Base64EncodingFlag_Multiline) {
		size_t lineCount = length / 64;
		if (lineCount & 0x3f)
			lineCount++;

		length += lineCount - 1;
	}

	char* dst = string->createBuffer(length);
	if (!dst)
		return -1;

	if (flags & Base64EncodingFlag_Multiline) {
		if (flags & Base64EncodingFlag_UrlChars)
			encodeImpl<GetBase64UrlChar, InsertNl>(dst, length, (uchar_t*)p, size);
		else
			encodeImpl<GetBase64Char, InsertNl>(dst, length, (uchar_t*)p, size);
	} else {
		if (flags & Base64EncodingFlag_UrlChars)
			encodeImpl<GetBase64UrlChar, InsertNoNl>(dst, length, (uchar_t*)p, size);
		else
			encodeImpl<GetBase64Char, InsertNoNl>(dst, length, (uchar_t*)p, size);
	}

	return length;
}